

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scc.cpp
# Opt level: O0

void __thiscall SCCTest_LoopReverse_Test::TestBody(SCCTest_LoopReverse_Test *this)

{
  initializer_list<unsigned_int> __l;
  initializer_list<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>
  __l_00;
  bool bVar1;
  char *message;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *local_150;
  AssertHelper local_128;
  Message local_120;
  allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>
  local_111;
  less<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_> local_110;
  undefined1 local_10f;
  allocator<unsigned_int> local_10e;
  less<unsigned_int> local_10d;
  uint local_10c [3];
  iterator local_100;
  size_type local_f8;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *local_f0;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> local_e8;
  iterator local_b8;
  size_type local_b0;
  set<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
  local_a8;
  SCCSet local_78;
  undefined1 local_48 [8];
  AssertionResult gtest_ar;
  undefined1 local_28 [8];
  Graph_conflict1 graph;
  SCCTest_LoopReverse_Test *this_local;
  
  graph.graph.
  super__Vector_base<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  Graph::Graph((Graph *)local_28,3);
  Graph::addEdge((Graph *)local_28,0,2);
  Graph::addEdge((Graph *)local_28,2,1);
  Graph::addEdge((Graph *)local_28,1,0);
  getSCCs(&local_78,(Graph_conflict1 *)local_28);
  local_10f = 1;
  local_10c[0] = 0;
  local_10c[1] = 1;
  local_10c[2] = 2;
  local_100 = local_10c;
  local_f8 = 3;
  local_f0 = &local_e8;
  std::allocator<unsigned_int>::allocator(&local_10e);
  __l._M_len = local_f8;
  __l._M_array = local_100;
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::set
            (&local_e8,__l,&local_10d,&local_10e);
  local_10f = 0;
  local_b8 = &local_e8;
  local_b0 = 1;
  std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>::
  allocator(&local_111);
  __l_00._M_len = local_b0;
  __l_00._M_array = local_b8;
  std::
  set<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
  ::set(&local_a8,__l_00,&local_110,&local_111);
  testing::internal::EqHelper::
  Compare<std::set<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::set<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_nullptr>
            ((EqHelper *)local_48,"getSCCs(graph)","(SCCSet({{0, 1, 2}}))",&local_78,&local_a8);
  std::
  set<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
  ::~set(&local_a8);
  std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>::
  ~allocator(&local_111);
  local_150 = (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)&local_b8
  ;
  do {
    local_150 = local_150 + -1;
    std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set(local_150);
  } while (local_150 != &local_e8);
  std::allocator<unsigned_int>::~allocator(&local_10e);
  std::
  set<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
  ::~set(&local_78);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_48);
  if (!bVar1) {
    testing::Message::Message(&local_120);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_48);
    testing::internal::AssertHelper::AssertHelper
              (&local_128,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/scc.cpp"
               ,0xbf,message);
    testing::internal::AssertHelper::operator=(&local_128,&local_120);
    testing::internal::AssertHelper::~AssertHelper(&local_128);
    testing::Message::~Message(&local_120);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_48);
  Graph::~Graph((Graph *)local_28);
  return;
}

Assistant:

TEST(SCCTest, LoopReverse) {
  // 0 <- 1 <- 2 <- 0
  // There is only one SCC here.
  Graph graph(3);
  graph.addEdge(0, 2);
  graph.addEdge(2, 1);
  graph.addEdge(1, 0);
  EXPECT_EQ(getSCCs(graph), (SCCSet({{0, 1, 2}})));
}